

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

void ClosePendingUpvalues(ExpressionContext *ctx,FunctionData *function)

{
  uint uVar1;
  ExprSequence *pEVar2;
  ExprBase **ppEVar3;
  VariableData *pVVar4;
  FunctionData *pFVar5;
  SynBase *pSVar6;
  ExprBase *pEVar7;
  ScopeData *pSVar8;
  ScopeData *curr;
  IntrusiveList<CloseUpvaluesData> *pIVar9;
  VariableHandle *pVVar10;
  ulong uVar11;
  CloseUpvaluesData *pCVar12;
  
  for (pSVar8 = ctx->scope; (pSVar8 != (ScopeData *)0x0 && (pSVar8->ownerType == (TypeBase *)0x0));
      pSVar8 = pSVar8->scope) {
    pFVar5 = pSVar8->ownerFunction;
    if (pFVar5 != (FunctionData *)0x0) goto LAB_00168b51;
  }
  pFVar5 = (FunctionData *)0x0;
LAB_00168b51:
  if (pFVar5 != function) {
    __assert_fail("function == ctx.GetCurrentFunction(ctx.scope)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0xb2b,"void ClosePendingUpvalues(ExpressionContext &, FunctionData *)");
  }
  pIVar9 = &function->closeUpvalues;
  if (function == (FunctionData *)0x0) {
    pIVar9 = &ctx->globalCloseUpvalues;
  }
  pCVar12 = pIVar9->head;
  do {
    if (pCVar12 == (CloseUpvaluesData *)0x0) {
      return;
    }
    switch(pCVar12->type) {
    case CLOSE_UPVALUES_FUNCTION:
      if (function == (FunctionData *)0x0) {
        __assert_fail("function",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0xb34,"void ClosePendingUpvalues(ExpressionContext &, FunctionData *)");
      }
      pSVar8 = (ScopeData *)&pCVar12->scope;
      do {
        pSVar8 = pSVar8->scope;
        if (pSVar8 == (ScopeData *)0x0) break;
        if ((pSVar8->variables).count != 0) {
          uVar11 = 0;
          do {
            pVVar4 = (pSVar8->variables).data[uVar11];
            if (pVVar4->usedAsExternal == true) {
              pEVar2 = pCVar12->expr;
              pSVar6 = &ExpressionContext::MakeInternal(ctx,pCVar12->source)->super_SynBase;
              pEVar7 = CreateUpvalueClose(ctx,pSVar6,pVVar4);
              uVar1 = (pEVar2->expressions).count;
              if (uVar1 == (pEVar2->expressions).max) {
                SmallArray<ExprBase_*,_4U>::grow(&pEVar2->expressions,uVar1);
              }
              ppEVar3 = (pEVar2->expressions).data;
              if (ppEVar3 == (ExprBase **)0x0) goto LAB_00168f4e;
              uVar1 = (pEVar2->expressions).count;
              (pEVar2->expressions).count = uVar1 + 1;
              ppEVar3[uVar1] = pEVar7;
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 < (pSVar8->variables).count);
        }
      } while (pSVar8->ownerFunction == (FunctionData *)0x0);
      break;
    case CLOSE_UPVALUES_BLOCK:
      pSVar8 = pCVar12->scope;
      if ((pSVar8->variables).count != 0) {
        uVar11 = 0;
        do {
          pVVar4 = (pSVar8->variables).data[uVar11];
          if (pVVar4->usedAsExternal == true) {
            pEVar2 = pCVar12->expr;
            pSVar6 = &ExpressionContext::MakeInternal(ctx,pCVar12->source)->super_SynBase;
            pEVar7 = CreateUpvalueClose(ctx,pSVar6,pVVar4);
            uVar1 = (pEVar2->expressions).count;
            if (uVar1 == (pEVar2->expressions).max) {
              SmallArray<ExprBase_*,_4U>::grow(&pEVar2->expressions,uVar1);
            }
            ppEVar3 = (pEVar2->expressions).data;
            if (ppEVar3 == (ExprBase **)0x0) goto LAB_00168f4e;
            uVar1 = (pEVar2->expressions).count;
            (pEVar2->expressions).count = uVar1 + 1;
            ppEVar3[uVar1] = pEVar7;
          }
          uVar11 = uVar11 + 1;
          pSVar8 = pCVar12->scope;
        } while (uVar11 < (pSVar8->variables).count);
      }
      break;
    case CLOSE_UPVALUES_BREAK:
      for (pSVar8 = pCVar12->scope;
          (pSVar8 != (ScopeData *)0x0 &&
          (pSVar8->breakDepth != pCVar12->scope->breakDepth - pCVar12->depth));
          pSVar8 = pSVar8->scope) {
        if ((pSVar8->variables).count != 0) {
          uVar11 = 0;
          do {
            pVVar4 = (pSVar8->variables).data[uVar11];
            if (pVVar4->usedAsExternal == true) {
              pEVar2 = pCVar12->expr;
              pSVar6 = &ExpressionContext::MakeInternal(ctx,pCVar12->source)->super_SynBase;
              pEVar7 = CreateUpvalueClose(ctx,pSVar6,pVVar4);
              uVar1 = (pEVar2->expressions).count;
              if (uVar1 == (pEVar2->expressions).max) {
                SmallArray<ExprBase_*,_4U>::grow(&pEVar2->expressions,uVar1);
              }
              ppEVar3 = (pEVar2->expressions).data;
              if (ppEVar3 == (ExprBase **)0x0) goto LAB_00168f4e;
              uVar1 = (pEVar2->expressions).count;
              (pEVar2->expressions).count = uVar1 + 1;
              ppEVar3[uVar1] = pEVar7;
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 < (pSVar8->variables).count);
        }
      }
      break;
    case CLOSE_UPVALUES_CONTINUE:
      for (pSVar8 = pCVar12->scope;
          (pSVar8 != (ScopeData *)0x0 &&
          (pSVar8->contiueDepth != pCVar12->scope->contiueDepth - pCVar12->depth));
          pSVar8 = pSVar8->scope) {
        if ((pSVar8->variables).count != 0) {
          uVar11 = 0;
          do {
            pVVar4 = (pSVar8->variables).data[uVar11];
            if (pVVar4->usedAsExternal == true) {
              pEVar2 = pCVar12->expr;
              pSVar6 = &ExpressionContext::MakeInternal(ctx,pCVar12->source)->super_SynBase;
              pEVar7 = CreateUpvalueClose(ctx,pSVar6,pVVar4);
              uVar1 = (pEVar2->expressions).count;
              if (uVar1 == (pEVar2->expressions).max) {
                SmallArray<ExprBase_*,_4U>::grow(&pEVar2->expressions,uVar1);
              }
              ppEVar3 = (pEVar2->expressions).data;
              if (ppEVar3 == (ExprBase **)0x0) goto LAB_00168f4e;
              uVar1 = (pEVar2->expressions).count;
              (pEVar2->expressions).count = uVar1 + 1;
              ppEVar3[uVar1] = pEVar7;
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 < (pSVar8->variables).count);
        }
      }
      break;
    case CLOSE_UPVALUES_ARGUMENT:
      if (function == (FunctionData *)0x0) {
        __assert_fail("function",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0xb6c,"void ClosePendingUpvalues(ExpressionContext &, FunctionData *)");
      }
      for (pVVar10 = (function->argumentVariables).head; pVVar10 != (VariableHandle *)0x0;
          pVVar10 = pVVar10->next) {
        if (pVVar10->variable->usedAsExternal == true) {
          pEVar2 = pCVar12->expr;
          pSVar6 = &ExpressionContext::MakeInternal(ctx,pCVar12->source)->super_SynBase;
          pEVar7 = CreateUpvalueClose(ctx,pSVar6,pVVar10->variable);
          uVar1 = (pEVar2->expressions).count;
          if (uVar1 == (pEVar2->expressions).max) {
            SmallArray<ExprBase_*,_4U>::grow(&pEVar2->expressions,uVar1);
          }
          ppEVar3 = (pEVar2->expressions).data;
          if (ppEVar3 == (ExprBase **)0x0) goto LAB_00168f4e;
          uVar1 = (pEVar2->expressions).count;
          (pEVar2->expressions).count = uVar1 + 1;
          ppEVar3[uVar1] = pEVar7;
        }
      }
      pVVar4 = function->contextArgument;
      if ((pVVar4 != (VariableData *)0x0) && (pVVar4->usedAsExternal == true)) {
        pEVar2 = pCVar12->expr;
        pSVar6 = &ExpressionContext::MakeInternal(ctx,pCVar12->source)->super_SynBase;
        pEVar7 = CreateUpvalueClose(ctx,pSVar6,pVVar4);
        uVar1 = (pEVar2->expressions).count;
        if (uVar1 == (pEVar2->expressions).max) {
          SmallArray<ExprBase_*,_4U>::grow(&pEVar2->expressions,uVar1);
        }
        ppEVar3 = (pEVar2->expressions).data;
        if (ppEVar3 == (ExprBase **)0x0) {
LAB_00168f4e:
          __assert_fail("data",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x162,
                        "void SmallArray<ExprBase *, 4>::push_back(const T &) [T = ExprBase *, N = 4]"
                       );
        }
        uVar1 = (pEVar2->expressions).count;
        (pEVar2->expressions).count = uVar1 + 1;
        ppEVar3[uVar1] = pEVar7;
      }
    }
    pCVar12 = pCVar12->next;
  } while( true );
}

Assistant:

void ClosePendingUpvalues(ExpressionContext &ctx, FunctionData *function)
{
	IntrusiveList<CloseUpvaluesData> &closeUpvalues = function ? function->closeUpvalues : ctx.globalCloseUpvalues;

	assert(function == ctx.GetCurrentFunction(ctx.scope));

	for(CloseUpvaluesData *curr = closeUpvalues.head; curr; curr = curr->next)
	{
		CloseUpvaluesData &data = *curr;

		switch(data.type)
		{
		case CLOSE_UPVALUES_FUNCTION:
			assert(function);

			for(ScopeData *scope = data.scope; scope; scope = scope->scope)
			{
				for(unsigned i = 0; i < scope->variables.size(); i++)
				{
					VariableData *variable = scope->variables[i];

					if(variable->usedAsExternal)
						data.expr->expressions.push_back(CreateUpvalueClose(ctx, ctx.MakeInternal(data.source), variable));
				}

				if(scope->ownerFunction)
					break;
			}
			break;
		case CLOSE_UPVALUES_BLOCK:
			for(unsigned i = 0; i < data.scope->variables.size(); i++)
			{
				VariableData *variable = data.scope->variables[i];

				if(variable->usedAsExternal)
					data.expr->expressions.push_back(CreateUpvalueClose(ctx, ctx.MakeInternal(data.source), variable));
			}
			break;
		case CLOSE_UPVALUES_BREAK:
			for(ScopeData *scope = data.scope; scope; scope = scope->scope)
			{
				if(scope->breakDepth == data.scope->breakDepth - data.depth)
					break;

				for(unsigned i = 0; i < scope->variables.size(); i++)
				{
					VariableData *variable = scope->variables[i];

					if(variable->usedAsExternal)
						data.expr->expressions.push_back(CreateUpvalueClose(ctx, ctx.MakeInternal(data.source), variable));
				}
			}
			break;
		case CLOSE_UPVALUES_CONTINUE:
			for(ScopeData *scope = data.scope; scope; scope = scope->scope)
			{
				if(scope->contiueDepth == data.scope->contiueDepth - data.depth)
					break;

				for(unsigned i = 0; i < scope->variables.size(); i++)
				{
					VariableData *variable = scope->variables[i];

					if(variable->usedAsExternal)
						data.expr->expressions.push_back(CreateUpvalueClose(ctx, ctx.MakeInternal(data.source), variable));
				}
			}
			break;
		case CLOSE_UPVALUES_ARGUMENT:
			assert(function);

			for(VariableHandle *curr = function->argumentVariables.head; curr; curr = curr->next)
			{
				if(curr->variable->usedAsExternal)
					data.expr->expressions.push_back(CreateUpvalueClose(ctx, ctx.MakeInternal(data.source), curr->variable));
			}

			if(VariableData *variable = function->contextArgument)
			{
				if(variable->usedAsExternal)
					data.expr->expressions.push_back(CreateUpvalueClose(ctx, ctx.MakeInternal(data.source), variable));
			}
		}
	}
}